

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

int STRING_concat_with_STRING(STRING_HANDLE s1,STRING_HANDLE s2)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  size_t __size;
  STRING *dest;
  
  if (s1 == (STRING_HANDLE)0x0 || s2 == (STRING_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar5 = 0x1bb;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1bb;
    }
    pcVar6 = "Invalid argument specified";
    iVar4 = 0x1ba;
  }
  else {
    pcVar6 = s1->s;
    sVar2 = strlen(pcVar6);
    sVar3 = strlen(s2->s);
    lVar7 = sVar3 + sVar2;
    if (CARRY8(sVar3,sVar2)) {
      lVar7 = -1;
    }
    __size = lVar7 + 1;
    if (__size == 0) {
      __size = 0xffffffffffffffff;
    }
    if ((__size != 0xffffffffffffffff) &&
       (pcVar6 = (char *)realloc(pcVar6,__size), pcVar6 != (char *)0x0)) {
      s1->s = pcVar6;
      memcpy(pcVar6 + sVar2,s2->s,sVar3 + 1);
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar5 = 0x1cb;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1cb;
    }
    pcVar6 = "Failure reallocating value, size:%zu";
    iVar4 = 0x1ca;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
            ,"STRING_concat_with_STRING",iVar4,1,pcVar6);
  return iVar5;
}

Assistant:

int STRING_concat_with_STRING(STRING_HANDLE s1, STRING_HANDLE s2)
{
    int result;
    if ((s1 == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_035: [String_Concat_with_STRING shall return a nonzero number if an error is encountered.] */
        LogError("Invalid argument specified");
        result = MU_FAILURE;
    }
    else
    {
        STRING* dest = (STRING*)s1;
        STRING* src = (STRING*)s2;

        size_t s1Length = strlen(dest->s);
        size_t s2Length = strlen(src->s);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(dest->s, realloc_size)) == NULL)
        {
            /* Codes_SRS_STRING_07_035: [String_Concat_with_STRING shall return a nonzero number if an error is encountered.] */
            LogError("Failure reallocating value, size:%zu", realloc_size);
            result = MU_FAILURE;
        }
        else
        {
            dest->s = temp;
            /* Codes_SRS_STRING_07_034: [String_Concat_with_STRING shall concatenate a given STRING_HANDLE variable with a source STRING_HANDLE.] */
            (void)memcpy(dest->s + s1Length, src->s, s2Length + 1);
            result = 0;
        }
    }
    return result;
}